

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<btSoftBody::Note>::copy
          (btAlignedObjectArray<btSoftBody::Note> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long in_RCX;
  long lVar1;
  int i;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)(int)dst;
  lVar5 = lVar4 * 0x58;
  for (; lVar4 < (int)src; lVar4 = lVar4 + 1) {
    puVar2 = (undefined8 *)
             ((long)&(((Note *)(&this->m_data->m_offset + -1))->super_Element).m_tag + lVar5);
    puVar3 = (undefined8 *)(in_RCX + lVar5);
    for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar3 = *puVar2;
      puVar2 = puVar2 + 1;
      puVar3 = puVar3 + 1;
    }
    lVar5 = lVar5 + 0x58;
  }
  return (int)in_RCX;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}